

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_(lyout *out,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  
  if (format == LYD_LYB) {
    iVar1 = lyb_print_data(out,root,options);
    return iVar1;
  }
  if (format != LYD_JSON) {
    if (format == LYD_XML) {
      iVar1 = xml_print_data(out,root,options);
      return iVar1;
    }
    ly_log(root->schema->module->ctx,LY_LLERR,LY_EINVAL,"Unknown output format.");
    return 1;
  }
  iVar1 = json_print_data(out,root,options);
  return iVar1;
}

Assistant:

static int
lyd_print_(struct lyout *out, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    switch (format) {
    case LYD_XML:
        return xml_print_data(out, root, options);
    case LYD_JSON:
        return json_print_data(out, root, options);
    case LYD_LYB:
        return lyb_print_data(out, root, options);
    default:
        LOGERR(root->schema->module->ctx, LY_EINVAL, "Unknown output format.");
        return EXIT_FAILURE;
    }
}